

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

uint __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseHex4<rapidjson::BasicIStreamWrapper<std::istream>>
          (GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
           *this,BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *is,
          size_t escapeOffset)

{
  Ch CVar1;
  bool bVar2;
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *in_RSI;
  undefined8 in_RDI;
  Ch c;
  int i;
  uint codepoint;
  undefined7 in_stack_ffffffffffffffd0;
  int local_28;
  uint local_24;
  
  local_24 = 0;
  local_28 = 0;
  do {
    if (3 < local_28) {
      return local_24;
    }
    CVar1 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek(in_RSI);
    local_24 = (int)CVar1 + local_24 * 0x10;
    if ((CVar1 < '0') || ('9' < CVar1)) {
      if ((CVar1 < 'A') || ('F' < CVar1)) {
        if ((CVar1 < 'a') || ('f' < CVar1)) {
          GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                         *)CONCAT17(CVar1,in_stack_ffffffffffffffd0),
                        (ParseErrorCode)((ulong)in_RDI >> 0x20),0x2417a5);
          bVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                   *)0x2417b0);
          if (bVar2) {
            return 0;
          }
        }
        else {
          local_24 = local_24 - 0x57;
        }
      }
      else {
        local_24 = local_24 - 0x37;
      }
    }
    else {
      local_24 = local_24 - 0x30;
    }
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
              ((BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)
               CONCAT17(CVar1,in_stack_ffffffffffffffd0));
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

unsigned ParseHex4(InputStream& is, size_t escapeOffset) {
        unsigned codepoint = 0;
        for (int i = 0; i < 4; i++) {
            Ch c = is.Peek();
            codepoint <<= 4;
            codepoint += static_cast<unsigned>(c);
            if (c >= '0' && c <= '9')
                codepoint -= '0';
            else if (c >= 'A' && c <= 'F')
                codepoint -= 'A' - 10;
            else if (c >= 'a' && c <= 'f')
                codepoint -= 'a' - 10;
            else {
                RAPIDJSON_PARSE_ERROR_NORETURN(kParseErrorStringUnicodeEscapeInvalidHex, escapeOffset);
                RAPIDJSON_PARSE_ERROR_EARLY_RETURN(0);
            }
            is.Take();
        }
        return codepoint;
    }